

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionController_AddPegoutTxOut_Test::TestBody
          (ConfidentialTransactionController_AddPegoutTxOut_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address addr;
  ConfidentialTransactionController txc;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff22c;
  Address *in_stack_fffffffffffff230;
  Address *this_00;
  undefined8 in_stack_fffffffffffff238;
  ConfidentialTransactionController *in_stack_fffffffffffff240;
  uint32_t in_stack_fffffffffffff248;
  undefined4 uVar5;
  uint32_t in_stack_fffffffffffff24c;
  Txid *in_stack_fffffffffffff250;
  Amount *value;
  undefined4 in_stack_fffffffffffff258;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff25c;
  ConfidentialAssetId *in_stack_fffffffffffff2d0;
  allocator *paVar7;
  Amount *in_stack_fffffffffffff2d8;
  undefined7 in_stack_fffffffffffff2e0;
  undefined1 in_stack_fffffffffffff2e7;
  ConfidentialTransactionController *in_stack_fffffffffffff2e8;
  AssertHelper local_ce8;
  Message local_ce0;
  string local_cd8;
  AssertionResult local_cb8;
  AssertHelper local_ca8;
  Message local_ca0;
  string local_c98 [32];
  AssertionResult local_c78;
  allocator local_c61;
  string local_c60;
  ConfidentialAssetId local_c40;
  int64_t local_c18;
  undefined1 local_c10;
  int64_t local_c08;
  undefined1 local_c00;
  allocator local_af9;
  string local_af8;
  ByteData local_ad8;
  allocator local_ab9;
  string local_ab8 [39];
  allocator local_a91;
  string local_a90;
  Address *in_stack_fffffffffffff598;
  BlockHash *in_stack_fffffffffffff5a0;
  ConfidentialAssetId *in_stack_fffffffffffff5a8;
  Amount *in_stack_fffffffffffff5b0;
  ConfidentialTransactionController *in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5d0;
  Pubkey *in_stack_fffffffffffff5d8;
  Privkey *in_stack_fffffffffffff5e0;
  string *in_stack_fffffffffffff5e8;
  uint32_t in_stack_fffffffffffff5f0;
  allocator local_a09;
  undefined8 in_stack_fffffffffffff5f8;
  undefined4 in_stack_fffffffffffff600;
  undefined8 in_stack_fffffffffffff608;
  Address local_9e8;
  allocator local_861;
  string local_860;
  BlockHash local_840;
  allocator local_819;
  string local_818;
  ConfidentialAssetId local_7f8;
  int64_t local_7d0;
  undefined1 local_7c8;
  int64_t local_7c0;
  undefined1 local_7b8;
  allocator local_6b1;
  string local_6b0;
  ConfidentialAssetId local_690;
  int64_t local_668;
  undefined1 local_660;
  int64_t local_658;
  undefined1 local_650;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_648;
  allocator local_629;
  string local_628;
  Address local_608;
  allocator local_389;
  string local_388;
  Txid local_368 [12];
  Address local_1d8;
  
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_fffffffffffff240,(uint32_t)((ulong)in_stack_fffffffffffff238 >> 0x20),
             (uint32_t)in_stack_fffffffffffff238);
  cfd::core::Address::Address(&local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_388,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_389);
  cfd::core::Txid::Txid(local_368,&local_388);
  cfd::ConfidentialTransactionController::AddTxIn
            ((ConfidentialTransactionController *)
             CONCAT44(in_stack_fffffffffffff25c,in_stack_fffffffffffff258),in_stack_fffffffffffff250
             ,in_stack_fffffffffffff24c,in_stack_fffffffffffff248);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)in_stack_fffffffffffff230);
  cfd::core::Txid::~Txid((Txid *)0x21541d);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_628,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA",&local_629)
  ;
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&local_608,&local_628,&local_648);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_668 = AVar3.amount_;
  local_660 = AVar3.ignore_check_;
  local_658 = local_668;
  local_650 = local_660;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6b0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_6b1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_690,&local_6b0);
  cfd::ConfidentialTransactionController::AddTxOut
            (in_stack_fffffffffffff2e8,
             (Address *)CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)in_stack_fffffffffffff230);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x215587);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  cfd::core::Address::~Address(in_stack_fffffffffffff230);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff240);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_7d0 = AVar3.amount_;
  local_7c8 = AVar3.ignore_check_;
  paVar7 = &local_819;
  local_7c0 = local_7d0;
  local_7b8 = local_7c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_818,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,paVar7);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_7f8,&local_818);
  paVar7 = &local_861;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_860,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,paVar7);
  cfd::core::BlockHash::BlockHash(&local_840,&local_860);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffff5f8,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",&local_a09);
  cfd::core::Address::Address(&local_9e8,(string *)&stack0xfffffffffffff5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffff5b8,
             "0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d",
             (allocator *)&stack0xfffffffffffff5b7);
  cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xfffffffffffff5d8,(string *)&stack0xfffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a90,"cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL",&local_a91)
  ;
  cfd::core::Privkey::FromWif((Privkey *)&stack0xfffffffffffff590,&local_a90,kRegtest,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ab8,
             "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))"
             ,&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_af8,
             "030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"
             ,&local_af9);
  cfd::core::ByteData::ByteData(&local_ad8,&local_af8);
  value = (Amount *)&local_ad8;
  this_00 = (Address *)&stack0xfffffffffffff5d8;
  uVar6 = 4;
  uVar5 = 0;
  uVar4 = 2;
  cfd::ConfidentialTransactionController::AddPegoutTxOut
            (in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,in_stack_fffffffffffff5d0,
             in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5e8,
             in_stack_fffffffffffff5f0,(ByteData *)in_stack_fffffffffffff5f8,
             in_stack_fffffffffffff600,(Address *)in_stack_fffffffffffff608);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)this_00);
  cfd::core::ByteData::~ByteData((ByteData *)0x2158ce);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator((allocator<char> *)&local_af9);
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  cfd::core::Privkey::~Privkey((Privkey *)0x21590f);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x215936);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff5b8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff5b7);
  cfd::core::Address::~Address(this_00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a09);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x215984);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2159ab);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_c18 = AVar3.amount_;
  local_c10 = AVar3.ignore_check_;
  local_c08 = local_c18;
  local_c00 = local_c10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c60,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_c61);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_c40,&local_c60);
  cfd::ConfidentialTransactionController::AddTxOutFee
            ((ConfidentialTransactionController *)CONCAT44(in_stack_fffffffffffff25c,uVar6),value,
             (ConfidentialAssetId *)CONCAT44(in_stack_fffffffffffff24c,uVar5));
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)this_00);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x215a95);
  std::__cxx11::string::~string((string *)&local_c60);
  std::allocator<char>::~allocator((allocator<char> *)&local_c61);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((AbstractTransactionController *)CONCAT44(in_stack_fffffffffffff22c,uVar4));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c78,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,pcVar2,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  std::__cxx11::string::~string(local_c98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c78);
  if (!bVar1) {
    testing::Message::Message(&local_ca0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x215feb);
    testing::internal::AssertHelper::AssertHelper
              (&local_ca8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xe3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ca8,&local_ca0);
    testing::internal::AssertHelper::~AssertHelper(&local_ca8);
    testing::Message::~Message((Message *)0x216048);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2160a0);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_cd8,&local_1d8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_cb8,"addr.GetAddress().c_str()",
             "\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"",pcVar2,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo")
  ;
  std::__cxx11::string::~string((string *)&local_cd8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cb8);
  if (!bVar1) {
    testing::Message::Message(&local_ce0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x216187);
    testing::internal::AssertHelper::AssertHelper
              (&local_ce8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ce8,&local_ce0);
    testing::internal::AssertHelper::~AssertHelper(&local_ce8);
    testing::Message::~Message((Message *)0x2161e4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x216239);
  cfd::core::Address::~Address(this_00);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_00);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut)
{
    ConfidentialTransactionController txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
}